

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

void __thiscall TypeSpacebase::saveXml(TypeSpacebase *this,ostream *s)

{
  AddrSpace *pAVar1;
  ostream *poVar2;
  char local_41;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<type",5);
  Datatype::saveXmlBasic(&this->super_Datatype,s);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"space","");
  pAVar1 = this->spaceid;
  local_41 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_41,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  xml_escape(s,(pAVar1->name)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  local_40 = (char *)CONCAT71(local_40._1_7_,0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(s,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar1 = (this->localframe).base;
  if (pAVar1 != (AddrSpace *)0x0) {
    (*pAVar1->_vptr_AddrSpace[7])(pAVar1,s,(this->localframe).offset);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"</type>",7);
  return;
}

Assistant:

void TypeSpacebase::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v(s,"space",spaceid->getName());
  s << '>';
  localframe.saveXml(s);
  s << "</type>";
}